

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O3

LY_ERR lys_parse_localfile(ly_ctx *ctx,char *name,char *revision,lysp_ctx *main_ctx,char *main_name,
                          ly_bool required,ly_set *new_mods,void **result)

{
  LY_ERR LVar1;
  LY_ERR extraout_EAX;
  LY_ERR extraout_EAX_00;
  char **searchpaths;
  undefined7 in_register_00000089;
  char *pcVar2;
  void *mod;
  LYS_INFORMAT format;
  ly_in *in;
  lysp_load_module_check_data check_data;
  char *local_78;
  lysp_submodule *local_70;
  LY_ERR local_68;
  LYS_INFORMAT local_64;
  ly_in *local_60;
  char *local_58;
  char *pcStack_50;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  
  local_68 = (LY_ERR)CONCAT71(in_register_00000089,required);
  local_78 = (char *)0x0;
  local_64 = LYS_IN_UNKNOWN;
  local_70 = (lysp_submodule *)0x0;
  local_48 = (char *)0x0;
  pcStack_40 = (char *)0x0;
  local_58 = (char *)0x0;
  pcStack_50 = (char *)0x0;
  local_38 = main_name;
  searchpaths = ly_ctx_get_searchdirs(ctx);
  LVar1 = lys_search_localfile
                    (searchpaths,(ctx->flags & 0x10) == 0,name,revision,&local_78,&local_64);
  pcVar2 = local_38;
  if (LVar1 == LY_SUCCESS) {
    if (local_78 == (char *)0x0) {
      LVar1 = local_68;
      if ((char)local_68 != '\0') {
        pcVar2 = "@";
        if (revision == (char *)0x0) {
          pcVar2 = "";
          revision = "";
        }
        ly_log(ctx,LY_LLERR,LY_ENOTFOUND,"Data model \"%s%s%s\" not found in local searchdirs.",name
               ,pcVar2,revision);
        LVar1 = extraout_EAX;
      }
    }
    else {
      ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Loading schema from \"%s\" file.");
      LVar1 = ly_in_new_filepath(local_78,0,&local_60);
      if (LVar1 == LY_SUCCESS) {
        local_48 = local_78;
        pcStack_40 = pcVar2;
        local_58 = name;
        pcStack_50 = revision;
        if (main_ctx == (lysp_ctx *)0x0) {
          LVar1 = lys_parse_in(ctx,local_60,local_64,lysp_load_module_check,&local_58,new_mods,
                               (lys_module **)&local_70);
        }
        else {
          LVar1 = lys_parse_submodule(ctx,local_60,local_64,main_ctx,lysp_load_module_check,
                                      &local_58,new_mods,&local_70);
        }
        ly_in_free(local_60,'\x01');
        if (LVar1 == LY_SUCCESS) {
          *result = local_70;
        }
      }
      else {
        ly_log(ctx,LY_LLERR,LVar1,"Unable to create input handler for filepath %s.",local_78);
      }
      free(local_78);
      LVar1 = extraout_EAX_00;
    }
  }
  return LVar1;
}

Assistant:

static LY_ERR
lys_parse_localfile(struct ly_ctx *ctx, const char *name, const char *revision, struct lysp_ctx *main_ctx,
        const char *main_name, ly_bool required, struct ly_set *new_mods, void **result)
{
    struct ly_in *in;
    char *filepath = NULL;
    LYS_INFORMAT format = 0;
    void *mod = NULL;
    LY_ERR ret = LY_SUCCESS;
    struct lysp_load_module_check_data check_data = {0};

    LY_CHECK_RET(lys_search_localfile(ly_ctx_get_searchdirs(ctx), !(ctx->flags & LY_CTX_DISABLE_SEARCHDIR_CWD), name,
            revision, &filepath, &format));
    if (!filepath) {
        if (required) {
            LOGERR(ctx, LY_ENOTFOUND, "Data model \"%s%s%s\" not found in local searchdirs.", name, revision ? "@" : "",
                    revision ? revision : "");
        }
        return LY_ENOTFOUND;
    }

    LOGVRB("Loading schema from \"%s\" file.", filepath);

    /* get the (sub)module */
    LY_CHECK_ERR_GOTO(ret = ly_in_new_filepath(filepath, 0, &in),
            LOGERR(ctx, ret, "Unable to create input handler for filepath %s.", filepath), cleanup);
    check_data.name = name;
    check_data.revision = revision;
    check_data.path = filepath;
    check_data.submoduleof = main_name;
    if (main_ctx) {
        ret = lys_parse_submodule(ctx, in, format, main_ctx, lysp_load_module_check, &check_data, new_mods,
                (struct lysp_submodule **)&mod);
    } else {
        ret = lys_parse_in(ctx, in, format, lysp_load_module_check, &check_data, new_mods, (struct lys_module **)&mod);

    }
    ly_in_free(in, 1);
    LY_CHECK_GOTO(ret, cleanup);

    *result = mod;

    /* success */

cleanup:
    free(filepath);
    return ret;
}